

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void anon_unknown.dwarf_52c65e::fillHeader(Header *header,char *sender,char *target,int seq)

{
  long *local_c0;
  long local_b8;
  long alStack_b0 [2];
  undefined1 local_a0 [16];
  _Alloc_hider local_90;
  char local_80 [16];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  field_metrics local_50;
  UtcTimeStamp local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,sender,(allocator<char> *)&local_48);
  local_a0._0_8_ = &PTR__FieldBase_00320f80;
  local_a0._8_4_ = 0x31;
  local_90._M_p = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_c0,local_b8 + (long)local_c0);
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50.m_length = 0;
  local_50.m_checksum = 0;
  local_a0._0_8_ = &PTR__FieldBase_00325010;
  local_70._M_p = (pointer)&local_60;
  FIX::FieldMap::setField(&header->super_FieldMap,(FieldBase *)local_a0,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_a0);
  if (local_c0 != alStack_b0) {
    operator_delete(local_c0,alStack_b0[0] + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,target,(allocator<char> *)&local_48);
  local_a0._0_8_ = &PTR__FieldBase_00320f80;
  local_a0._8_4_ = 0x38;
  local_90._M_p = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_c0,local_b8 + (long)local_c0);
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50.m_length = 0;
  local_50.m_checksum = 0;
  local_a0._0_8_ = &PTR__FieldBase_00325400;
  local_70._M_p = (pointer)&local_60;
  FIX::FieldMap::setField(&header->super_FieldMap,(FieldBase *)local_a0,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_a0);
  if (local_c0 != alStack_b0) {
    operator_delete(local_c0,alStack_b0[0] + 1);
  }
  FIX::DateTime::nowUtc();
  local_48.super_DateTime._8_8_ = local_b8;
  local_48.super_DateTime.m_time = alStack_b0[0];
  local_48.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_003254a8;
  FIX::UtcTimeStampField::UtcTimeStampField((UtcTimeStampField *)local_a0,0x34,&local_48,0);
  local_a0._0_8_ = &PTR__FieldBase_003254f0;
  FIX::FieldMap::setField(&header->super_FieldMap,(FieldBase *)local_a0,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_a0);
  FIX::UInt64Field::UInt64Field((UInt64Field *)local_a0,0x22,(long)seq);
  local_a0._0_8_ = &PTR__FieldBase_00325438;
  FIX::FieldMap::setField(&header->super_FieldMap,(FieldBase *)local_a0,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_a0);
  return;
}

Assistant:

void fillHeader(FIX::Header &header, const char *sender, const char *target, int seq) {
  header.setField(SenderCompID(sender));
  header.setField(TargetCompID(target));
  header.setField(SendingTime(UtcTimeStamp::now()));
  header.setField(MsgSeqNum(seq));
}